

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

void __thiscall CFG::eliminateEpsilonProductions(CFG *this)

{
  pointer *pppPVar1;
  pointer pcVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer ppPVar5;
  int iVar6;
  ostream *poVar7;
  pointer ppPVar8;
  pointer pbVar9;
  char *this_00;
  pointer __src;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  string symbol;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  pointer local_58;
  string local_50;
  
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expandNullableSymbols(this,&local_78);
  this_00 = "Nullable symbols: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Nullable symbols: ",0x12);
  vecToStr(&local_98,(CFG *)this_00,&local_78);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_58 = local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar9 = local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      pcVar2 = (pbVar9->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar2,pcVar2 + pbVar9->_M_string_length);
      uVar11 = (uint)((ulong)((long)(this->productionsP).
                                    super__Vector_base<Production_*,_std::allocator<Production_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->productionsP).
                                   super__Vector_base<Production_*,_std::allocator<Production_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (0 < (int)uVar11) {
        uVar10 = 0;
        do {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_98._M_dataplus._M_p,
                     local_98._M_dataplus._M_p + local_98._M_string_length);
          removeNullableSymbol
                    (this,&local_50,
                     (this->productionsP).
                     super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10]);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          uVar10 = uVar10 + 1;
        } while ((uVar11 & 0x7fffffff) != uVar10);
      }
      ppPVar8 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppPVar8) {
        uVar10 = 0;
        iVar12 = 0;
        do {
          pbVar3 = (ppPVar8[uVar10]->toP).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar4 = (ppPVar8[uVar10]->toP).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar3 == pbVar4) {
LAB_00115e2c:
            ppPVar8 = (this->productionsP).
                      super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            ppPVar5 = (this->productionsP).
                      super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            __src = ppPVar8 + uVar10 + 1;
            if (__src != ppPVar5) {
              memmove(ppPVar8 + uVar10,__src,(long)ppPVar5 - (long)__src);
            }
            pppPVar1 = &(this->productionsP).
                        super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppPVar1 = *pppPVar1 + -1;
            iVar12 = iVar12 + -1;
          }
          else if ((long)pbVar4 - (long)pbVar3 == 0x20) {
            iVar6 = std::__cxx11::string::compare((char *)pbVar3);
            if (iVar6 == 0) goto LAB_00115e2c;
          }
          iVar12 = iVar12 + 1;
          uVar10 = (ulong)iVar12;
          ppPVar8 = (this->productionsP).
                    super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar10 < (ulong)((long)(this->productionsP).
                                        super__Vector_base<Production_*,_std::allocator<Production_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar8
                                 >> 3));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != local_58);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

void CFG::eliminateEpsilonProductions() {
    std::vector<std::string> nullableSymbols = {};
    while (expandNullableSymbols(nullableSymbols)) {}

    std::cout << "Nullable symbols: " << vecToStr(nullableSymbols) << std::endl;

    for (std::string symbol: nullableSymbols) {
        int pSize = productionsP.size();
        for (int i = 0; i < pSize; ++i) {
            removeNullableSymbol(symbol, productionsP[i]);
        }

        for (int i = 0; i < productionsP.size(); ++i) {
            if (productionsP[i]->getToP().empty() or
                (productionsP[i]->getToP().size() == 1 and
                 productionsP[i]->getToP()[0] == "e")) {
                // Transition A -> e
                productionsP.erase(productionsP.begin() + i);
                i--;
            }
        }
    }
}